

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O2

vector<void_*,_std::allocator<void_*>_> *
vkt::shaderexecutor::anon_unknown_0::getInputOutputPointers
          (vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,
          vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *symbols
          ,vector<unsigned_int,_std::allocator<unsigned_int>_> *data,int numValues)

{
  pointer pSVar1;
  undefined4 in_EAX;
  int iVar2;
  int iVar3;
  long lVar4;
  int varNdx;
  long lVar5;
  undefined4 uStack_38;
  int local_34;
  
  _uStack_38 = CONCAT44(numValues,in_EAX);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            (__return_storage_ptr__,
             ((long)(symbols->
                    super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(symbols->
                   super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x38,
             (allocator_type *)((long)&uStack_38 + 3));
  lVar5 = 0;
  lVar4 = 0x20;
  iVar3 = 0;
  while( true ) {
    pSVar1 = (symbols->
             super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(symbols->
                     super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x38) <= lVar5)
    break;
    iVar2 = glu::VarType::getScalarSize((VarType *)((long)&(pSVar1->name)._M_dataplus._M_p + lVar4))
    ;
    (__return_storage_ptr__->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.
    super__Vector_impl_data._M_start[lVar5] =
         (data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_start + iVar3;
    iVar3 = iVar3 + iVar2 * local_34;
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0x38;
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<void*> getInputOutputPointers (const vector<Symbol>& symbols, vector<deUint32>& data, const int numValues)
{
	vector<void*>	pointers		(symbols.size());
	int				curScalarOffset	= 0;

	for (int varNdx = 0; varNdx < (int)symbols.size(); ++varNdx)
	{
		const Symbol&	var				= symbols[varNdx];
		const int		scalarSize		= var.varType.getScalarSize();

		// Uses planar layout as input/output specs do not support strides.
		pointers[varNdx] = &data[curScalarOffset];
		curScalarOffset += scalarSize*numValues;
	}

	DE_ASSERT(curScalarOffset == (int)data.size());

	return pointers;
}